

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void anon_unknown.dwarf_3d2fb2::addGlyphQuad
               (VertexArray *vertices,Vector2f position,Color *color,Glyph *glyph,float italicShear)

{
  VertexArray *pVVar1;
  long in_RDX;
  VertexArray *in_RSI;
  undefined8 in_XMM0_Qa;
  float in_XMM1_Da;
  float fVar2;
  float Y;
  float v2;
  float u2;
  float v1;
  float u1;
  float bottom;
  float right;
  float top;
  float left;
  float padding;
  Vertex *in_stack_fffffffffffffe78;
  VertexArray *this;
  Vector2<float> local_120;
  Vector2<float> local_118;
  Vertex local_110;
  Vector2<float> local_fc;
  Vector2<float> local_f4;
  Vertex local_ec;
  Vector2<float> local_d8;
  Vector2<float> local_d0;
  Vertex local_c8;
  Vector2<float> local_b4;
  Vector2<float> local_ac;
  Vertex local_a4;
  Vector2<float> local_90;
  Vector2<float> local_88;
  Vertex local_80;
  Vector2<float> local_6c;
  Vector2<float> local_64;
  Vertex local_5c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  undefined4 local_28;
  float local_24;
  VertexArray *local_18;
  undefined8 local_8;
  
  local_28 = 0x3f800000;
  local_2c = *(float *)(in_RDX + 0xc) - 1.0;
  local_30 = *(float *)(in_RDX + 0x10) - 1.0;
  local_34 = *(float *)(in_RDX + 0xc) + *(float *)(in_RDX + 0x14) + 1.0;
  local_38 = *(float *)(in_RDX + 0x10) + *(float *)(in_RDX + 0x18) + 1.0;
  local_3c = (float)*(int *)(in_RDX + 0x1c) - 1.0;
  local_40 = (float)*(int *)(in_RDX + 0x20) - 1.0;
  local_44 = (float)(*(int *)(in_RDX + 0x1c) + *(int *)(in_RDX + 0x24)) + 1.0;
  local_48 = (float)(*(int *)(in_RDX + 0x20) + *(int *)(in_RDX + 0x28)) + 1.0;
  local_8._0_4_ = (float)in_XMM0_Qa;
  fVar2 = (float)local_8 + local_2c;
  local_8._4_4_ = (float)((ulong)in_XMM0_Qa >> 0x20);
  Y = local_8._4_4_ + local_30;
  local_24 = in_XMM1_Da;
  local_18 = in_RSI;
  local_8 = in_XMM0_Qa;
  sf::Vector2<float>::Vector2(&local_64,-in_XMM1_Da * local_30 + fVar2,Y);
  this = local_18;
  sf::Vector2<float>::Vector2(&local_6c,local_3c,local_40);
  sf::Vertex::Vertex(&local_5c,&local_64,(Color *)this,&local_6c);
  sf::VertexArray::append(this,in_stack_fffffffffffffe78);
  sf::Vector2<float>::Vector2
            (&local_88,-local_24 * local_30 + (float)local_8 + local_34,local_8._4_4_ + local_30);
  pVVar1 = local_18;
  sf::Vector2<float>::Vector2(&local_90,local_44,local_40);
  sf::Vertex::Vertex(&local_80,&local_88,(Color *)pVVar1,&local_90);
  sf::VertexArray::append(this,in_stack_fffffffffffffe78);
  sf::Vector2<float>::Vector2
            (&local_ac,-local_24 * local_38 + (float)local_8 + local_2c,local_8._4_4_ + local_38);
  pVVar1 = local_18;
  sf::Vector2<float>::Vector2(&local_b4,local_3c,local_48);
  sf::Vertex::Vertex(&local_a4,&local_ac,(Color *)pVVar1,&local_b4);
  sf::VertexArray::append(this,in_stack_fffffffffffffe78);
  sf::Vector2<float>::Vector2
            (&local_d0,-local_24 * local_38 + (float)local_8 + local_2c,local_8._4_4_ + local_38);
  pVVar1 = local_18;
  sf::Vector2<float>::Vector2(&local_d8,local_3c,local_48);
  sf::Vertex::Vertex(&local_c8,&local_d0,(Color *)pVVar1,&local_d8);
  sf::VertexArray::append(this,in_stack_fffffffffffffe78);
  sf::Vector2<float>::Vector2
            (&local_f4,-local_24 * local_30 + (float)local_8 + local_34,local_8._4_4_ + local_30);
  pVVar1 = local_18;
  sf::Vector2<float>::Vector2(&local_fc,local_44,local_40);
  sf::Vertex::Vertex(&local_ec,&local_f4,(Color *)pVVar1,&local_fc);
  sf::VertexArray::append(this,in_stack_fffffffffffffe78);
  sf::Vector2<float>::Vector2
            (&local_118,-local_24 * local_38 + (float)local_8 + local_34,local_8._4_4_ + local_38);
  sf::Vector2<float>::Vector2(&local_120,local_44,local_48);
  sf::Vertex::Vertex(&local_110,&local_118,(Color *)local_18,&local_120);
  sf::VertexArray::append(this,in_stack_fffffffffffffe78);
  return;
}

Assistant:

void addGlyphQuad(sf::VertexArray& vertices, sf::Vector2f position, const sf::Color& color, const sf::Glyph& glyph, float italicShear)
    {
        float padding = 1.0;

        float left   = glyph.bounds.left - padding;
        float top    = glyph.bounds.top - padding;
        float right  = glyph.bounds.left + glyph.bounds.width + padding;
        float bottom = glyph.bounds.top  + glyph.bounds.height + padding;

        float u1 = static_cast<float>(glyph.textureRect.left) - padding;
        float v1 = static_cast<float>(glyph.textureRect.top) - padding;
        float u2 = static_cast<float>(glyph.textureRect.left + glyph.textureRect.width) + padding;
        float v2 = static_cast<float>(glyph.textureRect.top  + glyph.textureRect.height) + padding;

        vertices.append(sf::Vertex(sf::Vector2f(position.x + left  - italicShear * top   , position.y + top),    color, sf::Vector2f(u1, v1)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + right - italicShear * top   , position.y + top),    color, sf::Vector2f(u2, v1)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + left  - italicShear * bottom, position.y + bottom), color, sf::Vector2f(u1, v2)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + left  - italicShear * bottom, position.y + bottom), color, sf::Vector2f(u1, v2)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + right - italicShear * top   , position.y + top),    color, sf::Vector2f(u2, v1)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + right - italicShear * bottom, position.y + bottom), color, sf::Vector2f(u2, v2)));
    }